

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.h
# Opt level: O0

Name wasm::Names::
     getValidNameGivenExisting<std::unordered_set<wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<wasm::Name>>>
               (Name root,
               unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
               *existingNames)

{
  IString IVar1;
  size_type sVar2;
  string *in_R9;
  Name NVar3;
  allocator<char> local_91;
  string local_90 [32];
  anon_class_8_1_ae48ce9d local_70;
  function<bool_(wasm::Name)> local_68;
  Names *local_48;
  char *pcStack_40;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  *local_30;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  *existingNames_local;
  Name root_local;
  
  pcStack_40 = root.super_IString.str._M_str;
  local_48 = root.super_IString.str._M_len;
  local_70.existingNames = existingNames;
  local_30 = existingNames;
  existingNames_local =
       (unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
        *)local_48;
  root_local.super_IString.str._M_len = (size_t)pcStack_40;
  std::function<bool(wasm::Name)>::
  function<wasm::Names::getValidNameGivenExisting<std::unordered_set<wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<wasm::Name>>>(wasm::Name,std::unordered_set<wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<wasm::Name>>const&)::_lambda(wasm::Name)_1_,void>
            ((function<bool(wasm::Name)> *)&local_68,&local_70);
  sVar2 = std::
          unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
          ::size(local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_90,"_",&local_91);
  NVar3.super_IString.str._M_str = (char *)&local_68;
  NVar3.super_IString.str._M_len = (size_t)pcStack_40;
  NVar3 = getValidName(local_48,NVar3,(function<bool_(wasm::Name)> *)(sVar2 & 0xffffffff),
                       (Index)local_90,in_R9);
  root_local.super_IString.str._M_str = NVar3.super_IString.str._M_len;
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  std::function<bool_(wasm::Name)>::~function(&local_68);
  IVar1.str._M_str = NVar3.super_IString.str._M_str;
  IVar1.str._M_len = (size_t)root_local.super_IString.str._M_str;
  return (IString)(IString)IVar1.str;
}

Assistant:

inline Name getValidNameGivenExisting(Name root, const T& existingNames) {
  return getValidName(
    root,
    [&](Name test) { return !existingNames.count(test); },
    existingNames.size());
}